

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImGuiStorage::Clear(ImGuiStorage *this)

{
  int *piVar1;
  ImGuiStoragePair *pIVar2;
  
  pIVar2 = (this->Data).Data;
  if (pIVar2 != (ImGuiStoragePair *)0x0) {
    (this->Data).Size = 0;
    (this->Data).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    (this->Data).Data = (ImGuiStoragePair *)0x0;
  }
  return;
}

Assistant:

void                Clear() { Data.clear(); }